

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objtracker.h
# Opt level: O0

void __thiscall
CObjectTracker::AddAllocation<_cl_device_id*>(CObjectTracker *this,_cl_device_id *obj)

{
  CTracker *pCVar1;
  cl_device_id in_RSI;
  CObjectTracker *in_RDI;
  
  if (in_RSI != (cl_device_id)0x0) {
    pCVar1 = GetTracker(in_RDI,in_RSI);
    LOCK();
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

void    AddAllocation( T obj )
    {
        if( obj )
        {
            GetTracker(obj).NumAllocations.fetch_add(1, std::memory_order_relaxed);
        }
    }